

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_move_16_aw_aw(void)

{
  uint value;
  uint uVar1;
  
  value = OPER_AW_16();
  uVar1 = m68ki_read_imm_16();
  m68ki_write_16_fc((int)(short)uVar1,m68ki_cpu.s_flag | 1,value);
  m68ki_cpu.n_flag = value >> 8;
  m68ki_cpu.not_z_flag = value;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  return;
}

Assistant:

static void m68k_op_move_16_aw_aw(void)
{
	uint res = OPER_AW_16();
	uint ea = EA_AW_16();

	m68ki_write_16(ea, res);

	FLAG_N = NFLAG_16(res);
	FLAG_Z = res;
	FLAG_V = VFLAG_CLEAR;
	FLAG_C = CFLAG_CLEAR;
}